

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_cfg.cpp
# Opt level: O0

spv_result_t spvtools::val::anon_unknown_22::ValidatePhi(ValidationState_t *_,Instruction *inst)

{
  Instruction *pIVar1;
  bool bVar2;
  uint32_t uVar3;
  AddressingModel AVar4;
  Op OVar5;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar6;
  size_type sVar7;
  DiagnosticStream *pDVar8;
  Feature *pFVar9;
  spv_const_validator_options psVar10;
  vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_> *pvVar11;
  ulong uVar12;
  size_type sVar13;
  string local_12b8;
  DiagnosticStream local_1298;
  string local_10c0;
  string local_10a0;
  DiagnosticStream local_1080;
  uint *local_ea8;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_ea0;
  string local_e98;
  DiagnosticStream local_e78;
  string local_ca0;
  string local_c80;
  string local_c60;
  DiagnosticStream local_c40;
  uint32_t local_a68;
  uint32_t local_a64;
  uint32_t inc_type_id;
  uint32_t inc_id;
  size_t i;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  observed_predecessors;
  size_type local_a18;
  DiagnosticStream local_a10;
  ulong local_838;
  size_t num_edges;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_828;
  const_iterator local_820;
  uint *local_818;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_810;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_808;
  const_iterator local_800;
  uint *local_7f8;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_7f0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_7e8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_7d8;
  BasicBlock **local_7d0;
  BasicBlock **local_7c8;
  undefined1 local_7c0 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> pred_ids;
  DiagnosticStream local_7a0;
  Op local_5c4;
  Instruction *pIStack_5c0;
  Op type_opcode;
  Instruction *type_inst;
  DiagnosticStream local_3e0;
  DiagnosticStream local_208;
  ulong local_30;
  size_t num_in_ops;
  BasicBlock *block;
  Instruction *inst_local;
  ValidationState_t *__local;
  
  block = (BasicBlock *)inst;
  inst_local = (Instruction *)_;
  num_in_ops = (size_t)Instruction::block(inst);
  pvVar6 = Instruction::words((Instruction *)block);
  sVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar6);
  pIVar1 = inst_local;
  local_30 = sVar7 - 3;
  if ((local_30 & 1) == 0) {
    uVar3 = Instruction::type_id((Instruction *)block);
    bVar2 = ValidationState_t::IsVoidType((ValidationState_t *)pIVar1,uVar3);
    pIVar1 = inst_local;
    if (bVar2) {
      ValidationState_t::diag
                (&local_3e0,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,
                 (Instruction *)block);
      pDVar8 = DiagnosticStream::operator<<
                         (&local_3e0,(char (*) [37])"OpPhi must not have void result type");
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
      DiagnosticStream::~DiagnosticStream(&local_3e0);
    }
    else {
      uVar3 = Instruction::type_id((Instruction *)block);
      bVar2 = ValidationState_t::IsPointerType((ValidationState_t *)pIVar1,uVar3);
      if (((bVar2) &&
          (AVar4 = ValidationState_t::addressing_model((ValidationState_t *)inst_local),
          AVar4 == Logical)) &&
         (pFVar9 = ValidationState_t::features((ValidationState_t *)inst_local),
         (pFVar9->variable_pointers & 1U) == 0)) {
        ValidationState_t::diag
                  ((DiagnosticStream *)&type_inst,(ValidationState_t *)inst_local,
                   SPV_ERROR_INVALID_DATA,(Instruction *)block);
        pDVar8 = DiagnosticStream::operator<<
                           ((DiagnosticStream *)&type_inst,
                            (char (*) [47])"Using pointers with OpPhi requires capability ");
        pDVar8 = DiagnosticStream::operator<<
                           (pDVar8,(char (*) [50])
                                   "VariablePointers or VariablePointersStorageBuffer");
        __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
        DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&type_inst);
      }
      else {
        pIVar1 = inst_local;
        uVar3 = Instruction::type_id((Instruction *)block);
        pIStack_5c0 = ValidationState_t::FindDef((ValidationState_t *)pIVar1,uVar3);
        if (pIStack_5c0 == (Instruction *)0x0) {
          __assert_fail("type_inst",
                        "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_cfg.cpp"
                        ,0x3f,
                        "spv_result_t spvtools::val::(anonymous namespace)::ValidatePhi(ValidationState_t &, const Instruction *)"
                       );
        }
        local_5c4 = Instruction::opcode(pIStack_5c0);
        psVar10 = ValidationState_t::options((ValidationState_t *)inst_local);
        if ((((psVar10->before_hlsl_legalization & 1U) != 0) ||
            (bVar2 = ValidationState_t::HasCapability
                               ((ValidationState_t *)inst_local,BindlessTextureNV), bVar2)) ||
           ((local_5c4 != OpTypeSampledImage &&
            ((bVar2 = ValidationState_t::HasCapability((ValidationState_t *)inst_local,Shader),
             !bVar2 || ((local_5c4 != OpTypeImage && (local_5c4 != OpTypeSampler)))))))) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_7c0);
          pvVar11 = BasicBlock::predecessors((BasicBlock *)num_in_ops);
          local_7c8 = (BasicBlock **)
                      std::
                      vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                      ::begin(pvVar11);
          pvVar11 = BasicBlock::predecessors((BasicBlock *)num_in_ops);
          local_7d0 = (BasicBlock **)
                      std::
                      vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                      ::end(pvVar11);
          local_7d8 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                      std::back_inserter<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_7c0);
          local_7e8 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                      std::
                      transform<__gnu_cxx::__normal_iterator<spvtools::val::BasicBlock*const*,std::vector<spvtools::val::BasicBlock*,std::allocator<spvtools::val::BasicBlock*>>>,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>,spvtools::val::(anonymous_namespace)::ValidatePhi(spvtools::val::ValidationState_t&,spvtools::val::Instruction_const*)::__0>
                                (local_7c8,local_7d0,local_7d8);
          local_7f0._M_current =
               (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                                 ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_7c0);
          local_7f8 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                         local_7c0);
          std::
          sort<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                    (local_7f0,
                     (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                      )local_7f8);
          local_810._M_current =
               (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                                 ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_7c0);
          local_818 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                         local_7c0);
          local_808 = std::
                      unique<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                                (local_810,
                                 (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                  )local_818);
          __gnu_cxx::
          __normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>
          ::__normal_iterator<unsigned_int*>
                    ((__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>
                      *)&local_800,&local_808);
          local_828._M_current =
               (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                                 ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_7c0);
          __gnu_cxx::
          __normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>
          ::__normal_iterator<unsigned_int*>
                    ((__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>
                      *)&local_820,&local_828);
          num_edges = (size_t)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::erase
                                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                         local_7c0,local_800,local_820);
          uVar12 = local_30 >> 1;
          local_838 = uVar12;
          sVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_7c0);
          if (uVar12 == sVar7) {
            std::
            unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
            ::unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                             *)&i);
            _inc_type_id = 3;
            while( true ) {
              uVar12 = _inc_type_id;
              pvVar6 = Instruction::words((Instruction *)block);
              sVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar6);
              if (sVar7 <= uVar12) break;
              local_a64 = Instruction::word((Instruction *)block,_inc_type_id);
              if ((_inc_type_id & 1) == 1) {
                local_a68 = ValidationState_t::GetTypeId((ValidationState_t *)inst_local,local_a64);
                uVar3 = Instruction::type_id((Instruction *)block);
                if (uVar3 != local_a68) {
                  ValidationState_t::diag
                            (&local_c40,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,
                             (Instruction *)block);
                  pDVar8 = DiagnosticStream::operator<<
                                     (&local_c40,(char (*) [26])"OpPhi\'s result type <id> ");
                  pIVar1 = inst_local;
                  uVar3 = Instruction::type_id((Instruction *)block);
                  ValidationState_t::getIdName_abi_cxx11_
                            (&local_c60,(ValidationState_t *)pIVar1,uVar3);
                  pDVar8 = DiagnosticStream::operator<<(pDVar8,&local_c60);
                  pDVar8 = DiagnosticStream::operator<<
                                     (pDVar8,(char (*) [37])" does not match incoming value <id> ");
                  ValidationState_t::getIdName_abi_cxx11_
                            (&local_c80,(ValidationState_t *)inst_local,local_a64);
                  pDVar8 = DiagnosticStream::operator<<(pDVar8,&local_c80);
                  pDVar8 = DiagnosticStream::operator<<(pDVar8,(char (*) [12])0x61d21c);
                  ValidationState_t::getIdName_abi_cxx11_
                            (&local_ca0,(ValidationState_t *)inst_local,local_a68);
                  pDVar8 = DiagnosticStream::operator<<(pDVar8,&local_ca0);
                  pDVar8 = DiagnosticStream::operator<<(pDVar8,(char (*) [2])0x61bbfb);
                  __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
                  std::__cxx11::string::~string((string *)&local_ca0);
                  std::__cxx11::string::~string((string *)&local_c80);
                  std::__cxx11::string::~string((string *)&local_c60);
                  DiagnosticStream::~DiagnosticStream(&local_c40);
                  goto LAB_0051ca97;
                }
              }
              else {
                OVar5 = ValidationState_t::GetIdOpcode((ValidationState_t *)inst_local,local_a64);
                if (OVar5 != OpLabel) {
                  ValidationState_t::diag
                            (&local_e78,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,
                             (Instruction *)block);
                  pDVar8 = DiagnosticStream::operator<<
                                     (&local_e78,
                                      (char (*) [35])"OpPhi\'s incoming basic block <id> ");
                  ValidationState_t::getIdName_abi_cxx11_
                            (&local_e98,(ValidationState_t *)inst_local,local_a64);
                  pDVar8 = DiagnosticStream::operator<<(pDVar8,&local_e98);
                  pDVar8 = DiagnosticStream::operator<<(pDVar8,(char (*) [20])" is not an OpLabel.")
                  ;
                  __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
                  std::__cxx11::string::~string((string *)&local_e98);
                  DiagnosticStream::~DiagnosticStream(&local_e78);
                  goto LAB_0051ca97;
                }
                local_ea0._M_current =
                     (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                        local_7c0);
                local_ea8 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                                              ((vector<unsigned_int,_std::allocator<unsigned_int>_>
                                                *)local_7c0);
                bVar2 = std::
                        binary_search<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,unsigned_int>
                                  (local_ea0,
                                   (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                    )local_ea8,&local_a64);
                if (!bVar2) {
                  ValidationState_t::diag
                            (&local_1080,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,
                             (Instruction *)block);
                  pDVar8 = DiagnosticStream::operator<<
                                     (&local_1080,
                                      (char (*) [35])"OpPhi\'s incoming basic block <id> ");
                  ValidationState_t::getIdName_abi_cxx11_
                            (&local_10a0,(ValidationState_t *)inst_local,local_a64);
                  pDVar8 = DiagnosticStream::operator<<(pDVar8,&local_10a0);
                  pDVar8 = DiagnosticStream::operator<<
                                     (pDVar8,(char (*) [31])" is not a predecessor of <id> ");
                  pIVar1 = inst_local;
                  uVar3 = BasicBlock::id((BasicBlock *)num_in_ops);
                  ValidationState_t::getIdName_abi_cxx11_
                            (&local_10c0,(ValidationState_t *)pIVar1,uVar3);
                  pDVar8 = DiagnosticStream::operator<<(pDVar8,&local_10c0);
                  pDVar8 = DiagnosticStream::operator<<(pDVar8,(char (*) [2])0x61bbfb);
                  __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
                  std::__cxx11::string::~string((string *)&local_10c0);
                  std::__cxx11::string::~string((string *)&local_10a0);
                  DiagnosticStream::~DiagnosticStream(&local_1080);
                  goto LAB_0051ca97;
                }
                sVar13 = std::
                         unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                         ::count((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                                  *)&i,&local_a64);
                if (sVar13 != 0) {
                  ValidationState_t::diag
                            (&local_1298,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,
                             (Instruction *)block);
                  pDVar8 = DiagnosticStream::operator<<
                                     (&local_1298,
                                      (char (*) [44])"OpPhi references incoming basic block <id> ");
                  ValidationState_t::getIdName_abi_cxx11_
                            (&local_12b8,(ValidationState_t *)inst_local,local_a64);
                  pDVar8 = DiagnosticStream::operator<<(pDVar8,&local_12b8);
                  pDVar8 = DiagnosticStream::operator<<(pDVar8,(char (*) [17])" multiple times.");
                  __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
                  std::__cxx11::string::~string((string *)&local_12b8);
                  DiagnosticStream::~DiagnosticStream(&local_1298);
                  goto LAB_0051ca97;
                }
                std::
                unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                ::insert((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                          *)&i,&local_a64);
              }
              _inc_type_id = _inc_type_id + 1;
            }
            __local._4_4_ = SPV_SUCCESS;
LAB_0051ca97:
            observed_predecessors._M_h._M_single_bucket._4_4_ = 1;
            std::
            unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
            ::~unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                              *)&i);
          }
          else {
            ValidationState_t::diag
                      (&local_a10,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,
                       (Instruction *)block);
            pDVar8 = DiagnosticStream::operator<<
                               (&local_a10,(char (*) [36])"OpPhi\'s number of incoming blocks (");
            pDVar8 = DiagnosticStream::operator<<(pDVar8,&local_838);
            pDVar8 = DiagnosticStream::operator<<
                               (pDVar8,(char (*) [45])
                                       ") does not match block\'s predecessor count (");
            pvVar11 = BasicBlock::predecessors((BasicBlock *)num_in_ops);
            local_a18 = std::
                        vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                        ::size(pvVar11);
            pDVar8 = DiagnosticStream::operator<<(pDVar8,&local_a18);
            pDVar8 = DiagnosticStream::operator<<(pDVar8,(char (*) [3])0x61cae8);
            __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
            DiagnosticStream::~DiagnosticStream(&local_a10);
            observed_predecessors._M_h._M_single_bucket._4_4_ = 1;
          }
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_7c0);
        }
        else {
          ValidationState_t::diag
                    (&local_7a0,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,
                     (Instruction *)block);
          pDVar8 = DiagnosticStream::operator<<
                             (&local_7a0,(char (*) [25])"Result type cannot be Op");
          pred_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)spvOpcodeString(local_5c4);
          pDVar8 = DiagnosticStream::operator<<
                             (pDVar8,(char **)&pred_ids.
                                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
          __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
          DiagnosticStream::~DiagnosticStream(&local_7a0);
        }
      }
    }
  }
  else {
    ValidationState_t::diag
              (&local_208,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,(Instruction *)block)
    ;
    pDVar8 = DiagnosticStream::operator<<
                       (&local_208,
                        (char (*) [73])
                        "OpPhi does not have an equal number of incoming values and basic blocks.");
    __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
    DiagnosticStream::~DiagnosticStream(&local_208);
  }
  return __local._4_4_;
}

Assistant:

spv_result_t ValidatePhi(ValidationState_t& _, const Instruction* inst) {
  auto block = inst->block();
  size_t num_in_ops = inst->words().size() - 3;
  if (num_in_ops % 2 != 0) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "OpPhi does not have an equal number of incoming values and "
              "basic blocks.";
  }

  if (_.IsVoidType(inst->type_id())) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "OpPhi must not have void result type";
  }
  if (_.IsPointerType(inst->type_id()) &&
      _.addressing_model() == spv::AddressingModel::Logical) {
    if (!_.features().variable_pointers) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Using pointers with OpPhi requires capability "
             << "VariablePointers or VariablePointersStorageBuffer";
    }
  }

  const Instruction* type_inst = _.FindDef(inst->type_id());
  assert(type_inst);
  const spv::Op type_opcode = type_inst->opcode();

  if (!_.options()->before_hlsl_legalization &&
      !_.HasCapability(spv::Capability::BindlessTextureNV)) {
    if (type_opcode == spv::Op::OpTypeSampledImage ||
        (_.HasCapability(spv::Capability::Shader) &&
         (type_opcode == spv::Op::OpTypeImage ||
          type_opcode == spv::Op::OpTypeSampler))) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << "Result type cannot be Op" << spvOpcodeString(type_opcode);
    }
  }

  // Create a uniqued vector of predecessor ids for comparison against
  // incoming values. OpBranchConditional %cond %label %label produces two
  // predecessors in the CFG.
  std::vector<uint32_t> pred_ids;
  std::transform(block->predecessors()->begin(), block->predecessors()->end(),
                 std::back_inserter(pred_ids),
                 [](const BasicBlock* b) { return b->id(); });
  std::sort(pred_ids.begin(), pred_ids.end());
  pred_ids.erase(std::unique(pred_ids.begin(), pred_ids.end()), pred_ids.end());

  size_t num_edges = num_in_ops / 2;
  if (num_edges != pred_ids.size()) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "OpPhi's number of incoming blocks (" << num_edges
           << ") does not match block's predecessor count ("
           << block->predecessors()->size() << ").";
  }

  std::unordered_set<uint32_t> observed_predecessors;

  for (size_t i = 3; i < inst->words().size(); ++i) {
    auto inc_id = inst->word(i);
    if (i % 2 == 1) {
      // Incoming value type must match the phi result type.
      auto inc_type_id = _.GetTypeId(inc_id);
      if (inst->type_id() != inc_type_id) {
        return _.diag(SPV_ERROR_INVALID_ID, inst)
               << "OpPhi's result type <id> " << _.getIdName(inst->type_id())
               << " does not match incoming value <id> " << _.getIdName(inc_id)
               << " type <id> " << _.getIdName(inc_type_id) << ".";
      }
    } else {
      if (_.GetIdOpcode(inc_id) != spv::Op::OpLabel) {
        return _.diag(SPV_ERROR_INVALID_ID, inst)
               << "OpPhi's incoming basic block <id> " << _.getIdName(inc_id)
               << " is not an OpLabel.";
      }

      // Incoming basic block must be an immediate predecessor of the phi's
      // block.
      if (!std::binary_search(pred_ids.begin(), pred_ids.end(), inc_id)) {
        return _.diag(SPV_ERROR_INVALID_ID, inst)
               << "OpPhi's incoming basic block <id> " << _.getIdName(inc_id)
               << " is not a predecessor of <id> " << _.getIdName(block->id())
               << ".";
      }

      // We must not have already seen this predecessor as one of the phi's
      // operands.
      if (observed_predecessors.count(inc_id) != 0) {
        return _.diag(SPV_ERROR_INVALID_ID, inst)
               << "OpPhi references incoming basic block <id> "
               << _.getIdName(inc_id) << " multiple times.";
      }

      // Note the fact that we have now observed this predecessor.
      observed_predecessors.insert(inc_id);
    }
  }

  return SPV_SUCCESS;
}